

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

CuePoint * __thiscall mkvparser::Cues::GetNext(Cues *this,CuePoint *pCurr)

{
  long lVar1;
  CuePoint **ppCVar2;
  longlong lVar3;
  CuePoint *pNext;
  CuePoint **pp;
  long index;
  CuePoint *pCurr_local;
  Cues *this_local;
  
  if ((((pCurr == (CuePoint *)0x0) || (lVar3 = CuePoint::GetTimeCode(pCurr), lVar3 < 0)) ||
      (this->m_cue_points == (CuePoint **)0x0)) || (this->m_count < 1)) {
    this_local = (Cues *)0x0;
  }
  else {
    lVar1 = pCurr->m_index;
    if (lVar1 < this->m_count) {
      ppCVar2 = this->m_cue_points;
      if ((ppCVar2 == (CuePoint **)0x0) || (ppCVar2[lVar1] != pCurr)) {
        this_local = (Cues *)0x0;
      }
      else if (lVar1 + 1 < this->m_count) {
        this_local = (Cues *)ppCVar2[lVar1 + 1];
        if ((this_local == (Cues *)0x0) ||
           (lVar3 = CuePoint::GetTimeCode((CuePoint *)this_local), lVar3 < 0)) {
          this_local = (Cues *)0x0;
        }
      }
      else {
        this_local = (Cues *)0x0;
      }
    }
    else {
      this_local = (Cues *)0x0;
    }
  }
  return (CuePoint *)this_local;
}

Assistant:

const CuePoint* Cues::GetNext(const CuePoint* pCurr) const {
  if (pCurr == NULL || pCurr->GetTimeCode() < 0 || m_cue_points == NULL ||
      m_count < 1) {
    return NULL;
  }

  long index = pCurr->m_index;
  if (index >= m_count)
    return NULL;

  CuePoint* const* const pp = m_cue_points;
  if (pp == NULL || pp[index] != pCurr)
    return NULL;

  ++index;

  if (index >= m_count)
    return NULL;

  CuePoint* const pNext = pp[index];

  if (pNext == NULL || pNext->GetTimeCode() < 0)
    return NULL;

  return pNext;
}